

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::FieldDescriptor::GetLocationPath
          (FieldDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  iterator iVar1;
  long *plVar2;
  int local_14;
  
  Descriptor::GetLocationPath(*(Descriptor **)(this + 0x38),output);
  iVar1._M_current =
       (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar1._M_current ==
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)output,iVar1,&DescriptorProto::kFieldFieldNumber);
  }
  else {
    *iVar1._M_current = 2;
    (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  if (this[0x34] == (FieldDescriptor)0x0) {
    plVar2 = (long *)(*(long *)(this + 0x38) + 0x30);
  }
  else if (*(long *)(this + 0x40) == 0) {
    plVar2 = (long *)(*(long *)(this + 0x20) + 0x80);
  }
  else {
    plVar2 = (long *)(*(long *)(this + 0x40) + 0x70);
  }
  iVar1._M_current =
       (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar1._M_current ==
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar1,&local_14);
  }
  else {
    *iVar1._M_current = (int)((ulong)((long)this - *plVar2) >> 3) * -0x11111111;
    (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  return;
}

Assistant:

void FieldDescriptor::GetLocationPath(vector<int>* output) const {
  containing_type()->GetLocationPath(output);
  output->push_back(DescriptorProto::kFieldFieldNumber);
  output->push_back(index());
}